

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Match.cc
# Opt level: O0

uint64_t __thiscall flow::MatchRegEx::evaluate(MatchRegEx *this,FlowString *condition,Runner *env)

{
  bool bVar1;
  RegExpContext *this_00;
  reference this_01;
  Result *local_68;
  pair<flow::util::RegExp,_unsigned_long> *one;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<flow::util::RegExp,_unsigned_long>,_std::allocator<std::pair<flow::util::RegExp,_unsigned_long>_>_>
  *__range1;
  Result *rs;
  RegExpContext *cx;
  Runner *env_local;
  FlowString *condition_local;
  MatchRegEx *this_local;
  
  this_00 = (RegExpContext *)Runner::userdata(env);
  if (this_00 == (RegExpContext *)0x0) {
    local_68 = (Result *)0x0;
  }
  else {
    local_68 = util::RegExpContext::regexMatch_abi_cxx11_(this_00);
  }
  __end1 = std::
           vector<std::pair<flow::util::RegExp,_unsigned_long>,_std::allocator<std::pair<flow::util::RegExp,_unsigned_long>_>_>
           ::begin(&this->map_);
  one = (pair<flow::util::RegExp,_unsigned_long> *)
        std::
        vector<std::pair<flow::util::RegExp,_unsigned_long>,_std::allocator<std::pair<flow::util::RegExp,_unsigned_long>_>_>
        ::end(&this->map_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::pair<flow::util::RegExp,_unsigned_long>_*,_std::vector<std::pair<flow::util::RegExp,_unsigned_long>,_std::allocator<std::pair<flow::util::RegExp,_unsigned_long>_>_>_>
                                *)&one);
    if (!bVar1) {
      return (this->super_Match).def_.elsePC;
    }
    this_01 = __gnu_cxx::
              __normal_iterator<const_std::pair<flow::util::RegExp,_unsigned_long>_*,_std::vector<std::pair<flow::util::RegExp,_unsigned_long>,_std::allocator<std::pair<flow::util::RegExp,_unsigned_long>_>_>_>
              ::operator*(&__end1);
    bVar1 = util::RegExp::match(&this_01->first,condition,local_68);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_std::pair<flow::util::RegExp,_unsigned_long>_*,_std::vector<std::pair<flow::util::RegExp,_unsigned_long>,_std::allocator<std::pair<flow::util::RegExp,_unsigned_long>_>_>_>
    ::operator++(&__end1);
  }
  return this_01->second;
}

Assistant:

uint64_t MatchRegEx::evaluate(const FlowString* condition, Runner* env) const {
  util::RegExpContext* cx = reinterpret_cast<util::RegExpContext*>(env->userdata());
  util::RegExp::Result* rs = cx ? cx->regexMatch() : nullptr;
  for (const std::pair<util::RegExp, uint64_t>& one : map_) {
    if (one.first.match(*condition, rs)) {
      return one.second;
    }
  }

  return def_.elsePC;  // no match found
}